

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.cpp
# Opt level: O0

void __thiscall indk::Neuron::Entry::doPrepare(Entry *this)

{
  bool bVar1;
  reference ppSVar2;
  Synapse *S;
  iterator __end1;
  iterator __begin1;
  vector<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_> *__range1;
  Entry *this_local;
  
  this->t = 0;
  this->tm = -1;
  __end1 = std::vector<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_>::begin
                     (&this->Synapses);
  S = (Synapse *)
      std::vector<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_>::end
                (&this->Synapses);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<indk::Neuron::Synapse_**,_std::vector<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_>_>
                                *)&S);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<indk::Neuron::Synapse_**,_std::vector<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_>_>
              ::operator*(&__end1);
    Synapse::doReset(*ppSVar2);
    __gnu_cxx::
    __normal_iterator<indk::Neuron::Synapse_**,_std::vector<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void indk::Neuron::Entry::doPrepare() {
    t = 0;
    tm = -1;
    for (auto S: Synapses) S -> doReset();
    //for (auto S: Synapses) S -> doPrepare();
}